

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_v4dwt_interleave_h
               (opj_v4dwt_t *dwt,OPJ_FLOAT32 *a,OPJ_UINT32 width,OPJ_UINT32 remaining_height)

{
  uint uVar1;
  OPJ_UINT32 j_1;
  OPJ_UINT32 j;
  OPJ_UINT32 x1;
  OPJ_UINT32 x0;
  OPJ_UINT32 k;
  OPJ_UINT32 i;
  OPJ_FLOAT32 *bi;
  OPJ_UINT32 remaining_height_local;
  OPJ_UINT32 width_local;
  OPJ_FLOAT32 *a_local;
  opj_v4dwt_t *dwt_local;
  
  _k = dwt->wavelet + dwt->cas;
  j = dwt->win_l_x0;
  j_1 = dwt->win_l_x1;
  _remaining_height_local = a;
  for (x1 = 0; x1 < 2; x1 = x1 + 1) {
    if ((((remaining_height < 4) || (((ulong)_remaining_height_local & 0xf) != 0)) ||
        (((ulong)_k & 0xf) != 0)) || ((width & 0xf) != 0)) {
      for (x0 = j; x0 < j_1; x0 = x0 + 1) {
        _k->f[x0 << 3] = _remaining_height_local[x0];
        if (remaining_height != 1) {
          _k->f[x0 * 8 + 1] = _remaining_height_local[width + x0];
          uVar1 = width + width + x0;
          if (remaining_height != 2) {
            _k->f[x0 * 8 + 2] = _remaining_height_local[uVar1];
            if (remaining_height != 3) {
              _k->f[x0 * 8 + 3] = _remaining_height_local[width + uVar1];
            }
          }
        }
      }
    }
    else {
      for (x0 = j; x0 < j_1; x0 = x0 + 1) {
        _k->f[x0 << 3] = _remaining_height_local[x0];
        _k->f[x0 * 8 + 1] = _remaining_height_local[width + x0];
        uVar1 = width + width + x0;
        _k->f[x0 * 8 + 2] = _remaining_height_local[uVar1];
        _k->f[x0 * 8 + 3] = _remaining_height_local[width + uVar1];
      }
    }
    _k = dwt->wavelet + (1 - (long)dwt->cas);
    _remaining_height_local = _remaining_height_local + dwt->sn;
    j = dwt->win_h_x0;
    j_1 = dwt->win_h_x1;
  }
  return;
}

Assistant:

static void opj_v4dwt_interleave_h(opj_v4dwt_t* OPJ_RESTRICT dwt,
                                   OPJ_FLOAT32* OPJ_RESTRICT a,
                                   OPJ_UINT32 width,
                                   OPJ_UINT32 remaining_height)
{
    OPJ_FLOAT32* OPJ_RESTRICT bi = (OPJ_FLOAT32*)(dwt->wavelet + dwt->cas);
    OPJ_UINT32 i, k;
    OPJ_UINT32 x0 = dwt->win_l_x0;
    OPJ_UINT32 x1 = dwt->win_l_x1;

    for (k = 0; k < 2; ++k) {
        if (remaining_height >= 4 && ((OPJ_SIZE_T) a & 0x0f) == 0 &&
                ((OPJ_SIZE_T) bi & 0x0f) == 0 && (width & 0x0f) == 0) {
            /* Fast code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                bi[i * 8 + 1] = a[j];
                j += width;
                bi[i * 8 + 2] = a[j];
                j += width;
                bi[i * 8 + 3] = a[j];
            }
        } else {
            /* Slow code path */
            for (i = x0; i < x1; ++i) {
                OPJ_UINT32 j = i;
                bi[i * 8    ] = a[j];
                j += width;
                if (remaining_height == 1) {
                    continue;
                }
                bi[i * 8 + 1] = a[j];
                j += width;
                if (remaining_height == 2) {
                    continue;
                }
                bi[i * 8 + 2] = a[j];
                j += width;
                if (remaining_height == 3) {
                    continue;
                }
                bi[i * 8 + 3] = a[j]; /* This one*/
            }
        }

        bi = (OPJ_FLOAT32*)(dwt->wavelet + 1 - dwt->cas);
        a += dwt->sn;
        x0 = dwt->win_h_x0;
        x1 = dwt->win_h_x1;
    }
}